

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pBufferDataUploadTests.cpp
# Opt level: O3

void __thiscall
deqp::gles3::Performance::anon_unknown_1::
BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>::
deinit(BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>
       *this)

{
  ShaderProgram *this_00;
  int iVar1;
  undefined4 extraout_var;
  
  if (this->m_bufferID != 0) {
    iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
    (**(code **)(CONCAT44(extraout_var,iVar1) + 0x438))(1,&this->m_bufferID);
    this->m_bufferID = 0;
  }
  this_00 = this->m_dummyProgram;
  if (this_00 != (ShaderProgram *)0x0) {
    glu::ShaderProgram::~ShaderProgram(this_00);
  }
  operator_delete(this_00,0xd0);
  this->m_dummyProgram = (ShaderProgram *)0x0;
  return;
}

Assistant:

void BasicBufferCase<SampleType>::deinit (void)
{
	if (m_bufferID)
	{
		m_context.getRenderContext().getFunctions().deleteBuffers(1, &m_bufferID);
		m_bufferID = 0;
	}

	delete m_dummyProgram;
	m_dummyProgram = DE_NULL;
}